

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

bool __thiscall Json::StyledWriter::isMultineArray(StyledWriter *this,Value *value)

{
  bool bVar1;
  bool bVar2;
  ArrayIndex AVar3;
  ArrayIndex AVar4;
  Value *pVVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  AVar3 = Value::size(value);
  bVar1 = this->rightMargin_ <= (int)(AVar3 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->childValues_,
                    (this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (0 < (int)AVar3 && !bVar1) {
    iVar6 = 1;
    do {
      pVVar5 = Value::operator[](value,iVar6 + -1);
      bVar1 = Value::isArray(pVVar5);
      if (bVar1) {
LAB_0055d463:
        AVar4 = Value::size(pVVar5);
        bVar1 = AVar4 != 0;
      }
      else {
        bVar1 = Value::isObject(pVVar5);
        if (bVar1) goto LAB_0055d463;
        bVar1 = false;
      }
    } while ((iVar6 < (int)AVar3) && (iVar6 = iVar6 + 1, !bVar1));
  }
  bVar2 = true;
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(long)(int)AVar3);
    this->addChildValues_ = true;
    iVar6 = AVar3 * 2 + 2;
    if (0 < (int)AVar3) {
      lVar7 = 8;
      uVar8 = 0;
      do {
        pVVar5 = Value::operator[](value,(int)uVar8);
        writeValue(this,pVVar5);
        iVar6 = iVar6 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar7);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x20;
      } while (AVar3 != uVar8);
    }
    this->addChildValues_ = false;
    bVar2 = this->rightMargin_ <= iVar6;
  }
  return bVar2;
}

Assistant:

bool StyledWriter::isMultineArray(const Value& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}